

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

Instr * __thiscall
Lowerer::LowerScopedStFld
          (Lowerer *this,Instr *stFldInstr,JnHelperMethod helperMethod,bool withInlineCache,
          bool withPropertyOperationFlags,PropertyOperationFlags flags)

{
  Instr *pIVar1;
  code *pcVar2;
  bool bVar3;
  IntConstOpnd *pIVar4;
  Opnd *pOVar5;
  undefined4 *puVar6;
  SymOpnd *pSVar7;
  PropertySymOpnd *pPVar8;
  Opnd *dst;
  Opnd *src;
  Instr *instrPrev;
  PropertyOperationFlags flags_local;
  bool withPropertyOperationFlags_local;
  bool withInlineCache_local;
  JnHelperMethod helperMethod_local;
  Instr *stFldInstr_local;
  Lowerer *this_local;
  
  pIVar1 = stFldInstr->m_prev;
  if (withPropertyOperationFlags) {
    pIVar4 = IR::IntConstOpnd::New((long)(int)flags,TyInt32,this->m_func,true);
    LowererMD::LoadHelperArgument(&this->m_lowererMD,stFldInstr,&pIVar4->super_Opnd);
  }
  if (!withInlineCache) {
    LoadScriptContext(this,stFldInstr);
  }
  pOVar5 = IR::Instr::UnlinkSrc2(stFldInstr);
  LowererMD::LoadHelperArgument(&this->m_lowererMD,stFldInstr,pOVar5);
  pOVar5 = IR::Instr::UnlinkSrc1(stFldInstr);
  LowererMD::LoadHelperArgument(&this->m_lowererMD,stFldInstr,pOVar5);
  pOVar5 = IR::Instr::UnlinkDst(stFldInstr);
  bVar3 = IR::Opnd::IsSymOpnd(pOVar5);
  if (bVar3) {
    pSVar7 = IR::Opnd::AsSymOpnd(pOVar5);
    bVar3 = Sym::IsPropertySym(pSVar7->m_sym);
    if (bVar3) goto LAB_0078cdf3;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar6 = 1;
  bVar3 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                     ,0x20e1,"(dst->IsSymOpnd() && dst->AsSymOpnd()->m_sym->IsPropertySym())",
                     "Expected property sym as dst of field store");
  if (!bVar3) {
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  }
  puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar6 = 0;
LAB_0078cdf3:
  LoadPropertySymAsArgument(this,stFldInstr,pOVar5);
  if (withInlineCache) {
    pSVar7 = IR::Opnd::AsSymOpnd(pOVar5);
    bVar3 = IR::SymOpnd::IsPropertySymOpnd(pSVar7);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x20e7,"(dst->AsSymOpnd()->IsPropertySymOpnd())",
                         "Need property sym operand to find the inline cache");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    pPVar8 = IR::Opnd::AsPropertySymOpnd(pOVar5);
    pIVar4 = IR::Opnd::CreateInlineCacheIndexOpnd(pPVar8->m_inlineCacheIndex,this->m_func);
    LowererMD::LoadHelperArgument(&this->m_lowererMD,stFldInstr,&pIVar4->super_Opnd);
    pPVar8 = IR::Opnd::AsPropertySymOpnd(pOVar5);
    pOVar5 = LoadRuntimeInlineCacheOpnd(this,stFldInstr,pPVar8,false);
    LowererMD::LoadHelperArgument(&this->m_lowererMD,stFldInstr,pOVar5);
    pOVar5 = LoadFunctionBodyOpnd(this,stFldInstr);
    LowererMD::LoadHelperArgument(&this->m_lowererMD,stFldInstr,pOVar5);
  }
  LowererMD::ChangeToHelperCall
            (&this->m_lowererMD,stFldInstr,helperMethod,(LabelInstr *)0x0,(Opnd *)0x0,
             (PropertySymOpnd *)0x0,false);
  return pIVar1;
}

Assistant:

IR::Instr *
Lowerer::LowerScopedStFld(IR::Instr * stFldInstr, IR::JnHelperMethod helperMethod, bool withInlineCache,
    bool withPropertyOperationFlags, Js::PropertyOperationFlags flags)
{
    IR::Instr *instrPrev = stFldInstr->m_prev;

    if (withPropertyOperationFlags)
    {
        m_lowererMD.LoadHelperArgument(stFldInstr,
            IR::IntConstOpnd::New(static_cast<IntConstType>(flags), IRType::TyInt32, m_func, true));
    }

    if(!withInlineCache)
    {
        LoadScriptContext(stFldInstr);
    }

    // Pass the default instance
    IR::Opnd *src = stFldInstr->UnlinkSrc2();
    m_lowererMD.LoadHelperArgument(stFldInstr, src);

    // Pass the value to store
    src = stFldInstr->UnlinkSrc1();
    m_lowererMD.LoadHelperArgument(stFldInstr, src);

    // Pass the property sym to store to
    IR::Opnd *dst = stFldInstr->UnlinkDst();
    AssertMsg(dst->IsSymOpnd() && dst->AsSymOpnd()->m_sym->IsPropertySym(), "Expected property sym as dst of field store");

    this->LoadPropertySymAsArgument(stFldInstr, dst);

    if (withInlineCache)
    {
        AssertMsg(dst->AsSymOpnd()->IsPropertySymOpnd(), "Need property sym operand to find the inline cache");

        m_lowererMD.LoadHelperArgument(
            stFldInstr,
            IR::Opnd::CreateInlineCacheIndexOpnd(dst->AsPropertySymOpnd()->m_inlineCacheIndex, m_func));

        // Not using the polymorphic inline cache because the fast path only uses the monomorphic inline cache
        this->m_lowererMD.LoadHelperArgument(stFldInstr, this->LoadRuntimeInlineCacheOpnd(stFldInstr, dst->AsPropertySymOpnd()));

        m_lowererMD.LoadHelperArgument(stFldInstr, LoadFunctionBodyOpnd(stFldInstr));
    }

    m_lowererMD.ChangeToHelperCall(stFldInstr, helperMethod);

    return instrPrev;
}